

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtracer-inl.h
# Opt level: O2

void __thiscall spdlog::details::backtracer::enable(backtracer *this,size_t size)

{
  circular_q<spdlog::details::log_msg_buffer> cStack_48;
  
  std::mutex::lock((mutex *)this);
  (this->enabled_)._M_base._M_i = true;
  circular_q<spdlog::details::log_msg_buffer>::circular_q(&cStack_48,size);
  circular_q<spdlog::details::log_msg_buffer>::copy_moveable(&this->messages_,&cStack_48);
  std::vector<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>::
  ~vector((vector<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
           *)&cStack_48.v_);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

SPDLOG_INLINE void backtracer::enable(size_t size) {
    std::lock_guard<std::mutex> lock{mutex_};
    enabled_.store(true, std::memory_order_relaxed);
    messages_ = circular_q<log_msg_buffer>{size};
}